

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O2

int __thiscall CSnapshotBuilder::Finish(CSnapshotBuilder *this,void *pSnapdata)

{
  uint uVar1;
  int iVar2;
  uint size;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  int i;
  bool bVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int __tmp;
  ulong uVar10;
  int iVar11;
  int i_1;
  long in_FS_OFFSET;
  int aItemSizes [1024];
  
  aItemSizes[2] = 0;
  aItemSizes[3] = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->m_NumItems;
  *(int *)pSnapdata = this->m_DataSize;
  *(uint *)((long)pSnapdata + 4) = uVar1;
  uVar5 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  for (; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined4 *)((long)pSnapdata + uVar5 * 4 + 8) =
         *(undefined4 *)(this->m_aData + this->m_aOffsets[uVar5]);
  }
  iVar11 = this->m_DataSize;
  for (uVar5 = 0; uVar5 != uVar10; uVar5 = uVar5 + 1) {
    if ((long)uVar5 < (long)(int)uVar1 + -1) {
      iVar9 = this->m_aOffsets[uVar5 + 1] - this->m_aOffsets[uVar5];
    }
    else {
      iVar9 = iVar11 - this->m_aOffsets[uVar5];
    }
    aItemSizes[uVar5] = iVar9;
  }
  uVar5 = 1;
  bVar4 = false;
  do {
    while (bVar6 = bVar4, iVar11 = (int)uVar5, iVar11 < (int)uVar1) {
      lVar7 = (long)iVar11;
      iVar9 = *(int *)((long)pSnapdata + lVar7 * 4 + 4);
      iVar2 = *(int *)((long)pSnapdata + uVar5 * 4 + 8);
      if (iVar2 < iVar9) {
        lVar8 = lVar7 + -1;
        *(int *)((long)pSnapdata + uVar5 * 4 + 8) = iVar9;
        *(int *)((long)pSnapdata + lVar8 * 4 + 8) = iVar2;
        iVar9 = this->m_aOffsets[uVar5];
        this->m_aOffsets[uVar5] = this->m_aOffsets[lVar7 + -1];
        this->m_aOffsets[lVar7 + -1] = iVar9;
        iVar9 = aItemSizes[uVar5];
        aItemSizes[uVar5] = aItemSizes[lVar8];
        aItemSizes[lVar8] = iVar9;
        bVar6 = true;
      }
      bVar4 = bVar6;
      uVar5 = (ulong)(iVar11 + 1);
    }
    iVar11 = 0;
    uVar5 = 1;
    bVar4 = false;
  } while (bVar6);
  for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    *(int *)((long)pSnapdata + uVar5 * 4 + (long)*(int *)((long)pSnapdata + 4) * 4 + 8) = iVar11;
    size = aItemSizes[uVar5];
    mem_copy((void *)((long)pSnapdata + (long)iVar11 + (long)*(int *)((long)pSnapdata + 4) * 8 + 8),
             this->m_aData + this->m_aOffsets[uVar5],size);
    iVar11 = iVar11 + size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return this->m_DataSize + uVar1 * 8 + 8;
  }
  __stack_chk_fail();
}

Assistant:

int CSnapshotBuilder::Finish(void *pSnapdata)
{
	// flattern and make the snapshot
	CSnapshot *pSnap = (CSnapshot *)pSnapdata;
	int OffsetSize = sizeof(int)*m_NumItems;
	int KeySize = sizeof(int)*m_NumItems;
	pSnap->m_DataSize = m_DataSize;
	pSnap->m_NumItems = m_NumItems;

	const int NumItems = m_NumItems;
	for(int i = 0; i < NumItems; i++)
	{
		pSnap->SortedKeys()[i] = GetItem(i)->Key();
	}

	// get full item sizes
	int aItemSizes[CSnapshotBuilder::MAX_ITEMS];

	for(int i = 0; i < NumItems; i++)
	{
		if(i < NumItems - 1)
		{
			aItemSizes[i] = m_aOffsets[i+1] - m_aOffsets[i];
		}
		else
		{
			aItemSizes[i] = m_DataSize - m_aOffsets[i];
		}
	}

	// bubble sort by keys
	bool Sorting = true;
	while(Sorting)
	{
		Sorting = false;

		for(int i = 1; i < NumItems; i++)
		{
			if(pSnap->SortedKeys()[i-1] > pSnap->SortedKeys()[i])
			{
				Sorting = true;
				std::swap(pSnap->SortedKeys()[i], pSnap->SortedKeys()[i-1]);
				std::swap(m_aOffsets[i], m_aOffsets[i-1]);
				std::swap(aItemSizes[i], aItemSizes[i-1]);
			}
		}
	}

	// copy sorted items
	int OffsetCur = 0;
	for(int i = 0; i < NumItems; i++)
	{
		pSnap->Offsets()[i] = OffsetCur;
		mem_copy(pSnap->DataStart()+OffsetCur, m_aData + m_aOffsets[i], aItemSizes[i]);
		OffsetCur += aItemSizes[i];
	}

	return sizeof(CSnapshot) + KeySize + OffsetSize + m_DataSize;
}